

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O2

bool __thiscall
slang::parsing::Preprocessor::applyMacroOps
          (Preprocessor *this,span<const_slang::parsing::Token,_18446744073709551615UL> tokens,
          SmallVectorBase<slang::parsing::Token> *dest)

{
  TokenKind *pTVar1;
  pointer ppVar2;
  pointer pTVar3;
  Token *pTVar4;
  LanguageVersion LVar5;
  undefined2 uVar6;
  undefined1 uVar8;
  undefined1 uVar9;
  BumpAllocator *pBVar7;
  _Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_> parentLexer
  ;
  undefined4 uVar10;
  undefined8 uVar11;
  Info *pIVar12;
  string_view rawText;
  Token endToken;
  Token TVar13;
  span<slang::parsing::Token,_18446744073709551615UL> bodyTokens;
  span<slang::parsing::Token,_18446744073709551615UL> bodyTokens_00;
  span<slang::parsing::Token,_18446744073709551615UL> bodyTokens_01;
  TokenKind TVar14;
  undefined8 uVar15;
  bool bVar16;
  int iVar17;
  SyntaxKind SVar18;
  Token *pTVar19;
  Diagnostic *this_00;
  SourceLocation SVar20;
  undefined4 extraout_var;
  size_type __pos;
  bool bVar21;
  __extent_storage<18446744073709551615UL> _Var22;
  char *pcVar23;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  long lVar24;
  SourceManager *pSVar25;
  SourceManager *sourceManager;
  __extent_storage<18446744073709551615UL> in_R8;
  pointer ppVar26;
  bool bVar27;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar28;
  basic_string_view<char,_std::char_traits<char>_> rawText_00;
  Trivia TVar29;
  Token startToken;
  Token startToken_00;
  string_view arg;
  Token startToken_01;
  span<slang::parsing::Token,_18446744073709551615UL> tokens_00;
  Token left_00;
  Token left_01;
  undefined1 local_388 [12];
  undefined4 uStack_37c;
  undefined8 local_370;
  Token stringify;
  Token token;
  string_view raw;
  Token syntheticComment;
  Token extraToAppend;
  Token left;
  undefined1 local_2e0 [136];
  undefined6 uStack_258;
  undefined2 local_252;
  undefined1 auStack_250 [16];
  pointer local_240;
  pointer local_238;
  pointer local_230;
  pointer local_228;
  pointer ppStack_220;
  pointer local_218;
  _Base_ptr p_Stack_210;
  _Base_ptr local_208;
  _Base_ptr p_Stack_200;
  SmallVector<slang::parsing::Token,_8UL> stringifyBuffer;
  SmallVector<slang::parsing::Trivia,_8UL> emptyArgTrivia;
  SmallVector<slang::parsing::Token,_8UL> commentBuffer;
  
  _Var22 = tokens._M_extent._M_extent_value;
  pSVar25 = (SourceManager *)tokens._M_ptr;
  emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>.data_ =
       (pointer)emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>.firstElement;
  emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>.len = 0;
  stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.data_ =
       (pointer)stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.firstElement;
  stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.len = 0;
  emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>.cap = 8;
  stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.cap = 8;
  commentBuffer.super_SmallVectorBase<slang::parsing::Token>.data_ =
       (pointer)commentBuffer.super_SmallVectorBase<slang::parsing::Token>.firstElement;
  commentBuffer.super_SmallVectorBase<slang::parsing::Token>.len = 0;
  commentBuffer.super_SmallVectorBase<slang::parsing::Token>.cap = 8;
  sourceManager = pSVar25;
  local_370 = dest;
  Token::Token(&stringify);
  Token::Token(&syntheticComment);
  Token::Token(&extraToAppend);
  local_230 = (pointer)(_Var22._M_extent_value - 1);
  ppVar26 = (pointer)0x0;
  bVar27 = false;
  bVar21 = false;
  do {
    if (_Var22._M_extent_value <= ppVar26) {
      if (stringify.info != (Info *)0x0) {
        SVar20 = Token::location(&stringify);
        sourceManager = (SourceManager *)0x60004;
        addDiag(this,(DiagCode)0x60004,SVar20);
      }
      SmallVectorBase<slang::parsing::Token>::cleanup
                (&commentBuffer.super_SmallVectorBase<slang::parsing::Token>,
                 (EVP_PKEY_CTX *)sourceManager);
      SmallVectorBase<slang::parsing::Token>::cleanup
                (&stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>,
                 (EVP_PKEY_CTX *)sourceManager);
      SmallVectorBase<slang::parsing::Trivia>::cleanup
                (&emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>,
                 (EVP_PKEY_CTX *)sourceManager);
      return bVar21;
    }
    Token::Token((Token *)local_388);
    pTVar1 = (TokenKind *)((long)&(pSVar25->mutex)._M_impl._M_rwlock + (long)ppVar26 * 0x10);
    uVar11 = *(undefined8 *)pTVar1;
    pIVar12 = *(Info **)(pTVar1 + 4);
    token.kind = (TokenKind)uVar11;
    token._2_2_ = SUB82((ulong)uVar11 >> 0x10,0);
    token.rawLen = (uint32_t)((ulong)uVar11 >> 0x20);
    token.info._0_4_ = SUB84(pIVar12,0);
    token.info._4_4_ = (undefined4)((ulong)pIVar12 >> 0x20);
    sourceManager = (SourceManager *)(ulong)(token.kind - 0x15a);
    if (token.kind - 0x15a < 2) {
      pTVar19 = (Token *)((long)&(pSVar25->mutex)._M_impl._M_rwlock + (long)ppVar26 * 0x10);
      if (stringify.info == (Info *)0x0) {
        stringify.kind = pTVar19->kind;
        stringify._2_1_ = pTVar19->field_0x2;
        stringify.numFlags.raw = (pTVar19->numFlags).raw;
        stringify.rawLen = pTVar19->rawLen;
        stringify.info = pTVar19->info;
        stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.len = 0;
        bVar27 = false;
        if ((token.kind == MacroTripleQuote) && ((int)(this->options).languageVersion < 1)) {
          SVar20 = Token::location(&token);
          this_00 = addDiag(this,(DiagCode)0x20001,SVar20);
          LVar5 = (this->options).languageVersion;
          pcVar23 = "1800-2017";
          sourceManager = (SourceManager *)0x9;
          if (LVar5 != Default) {
            if (LVar5 == v1800_2023) {
              pcVar23 = "1800-2023";
            }
            else {
              pcVar23 = "";
              sourceManager = (SourceManager *)0x0;
            }
          }
          arg._M_str = pcVar23;
          arg._M_len = (size_t)sourceManager;
          Diagnostic::operator<<(this_00,arg);
          goto LAB_00186e0c;
        }
      }
      else {
        sourceManager = (SourceManager *)(stringify._0_8_ & 0xffff);
        if (token.kind == stringify.kind) {
          bodyTokens._M_extent._M_extent_value =
               stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.len;
          bodyTokens._M_ptr = stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.data_;
          startToken.info = stringify.info;
          startToken.kind = stringify.kind;
          startToken._2_1_ = stringify._2_1_;
          startToken.numFlags.raw = stringify.numFlags.raw;
          startToken.rawLen = stringify.rawLen;
          sourceManager = (SourceManager *)stringify._0_8_;
          in_R8._M_extent_value = stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.len;
          _local_388 = (undefined1  [16])
                       Lexer::stringify((Lexer *)(this->lexerStack).
                                                 super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                                 .data_[(this->lexerStack).
                                                                                                                
                                                  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                                  .len - 1]._M_t.
                                                 super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                                                 .
                                                 super__Head_base<0UL,_slang::parsing::Lexer_*,_false>
                                        ,startToken,bodyTokens,*pTVar19);
          Token::Token(&left);
          TVar13 = left;
          stringify.kind = left.kind;
          stringify._2_1_ = left._2_1_;
          stringify.numFlags.raw = left.numFlags.raw;
          stringify.rawLen = left.rawLen;
          stringify.info = left.info;
          left = TVar13;
        }
        else {
          if (stringify.kind == MacroTripleQuote) {
            local_388._0_2_ = pTVar19->kind;
            local_388[2] = pTVar19->field_0x2;
            local_388[3] = pTVar19->numFlags;
            local_388._4_4_ = pTVar19->rawLen;
            local_388._8_4_ = *(undefined4 *)&pTVar19->info;
            uStack_37c = *(undefined4 *)((long)&pTVar19->info + 4);
            goto LAB_00186cec;
          }
          bodyTokens_00._M_extent._M_extent_value =
               stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.len;
          bodyTokens_00._M_ptr = stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.data_;
          startToken_00.info = stringify.info;
          startToken_00.kind = stringify.kind;
          startToken_00._2_1_ = stringify._2_1_;
          startToken_00.numFlags.raw = stringify.numFlags.raw;
          startToken_00.rawLen = stringify.rawLen;
          _local_388 = (undefined1  [16])
                       Lexer::stringify((Lexer *)(this->lexerStack).
                                                 super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                                 .data_[(this->lexerStack).
                                                                                                                
                                                  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                                  .len - 1]._M_t.
                                                 super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                                                 .
                                                 super__Head_base<0UL,_slang::parsing::Lexer_*,_false>
                                        ,startToken_00,bodyTokens_00,*pTVar19);
          Token::Token(&left);
          TVar13 = left;
          stringify.kind = left.kind;
          stringify._2_1_ = left._2_1_;
          stringify.numFlags.raw = left.numFlags.raw;
          stringify.rawLen = left.rawLen;
          stringify.info = left.info;
          sourceManager = (SourceManager *)this->alloc;
          local_218 = (pointer)0x2;
          p_Stack_210 = (_Base_ptr)0x3ffd7b;
          left = TVar13;
          SVar20 = Token::location(&token);
          local_228 = (pointer)0x0;
          ppStack_220 = (pointer)0x401ea3;
          in_R8._M_extent_value = 0;
          rawText._M_str = (char *)p_Stack_210;
          rawText._M_len = (size_t)local_218;
          Token::Token(&left,(BumpAllocator *)sourceManager,StringLiteral,
                       (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
                       rawText,(SourceLocation)
                               ((long)SVar20 * 0x10 + 0x200000000 >> 4 & 0xfffffffff0000000U |
                               (ulong)(SVar20._0_4_ & 0xfffffff)),
                       (string_view)(ZEXT816(0x401ea3) << 0x40));
          TVar13 = left;
          extraToAppend.kind = left.kind;
          extraToAppend._2_1_ = left._2_1_;
          extraToAppend.numFlags.raw = left.numFlags.raw;
          extraToAppend.rawLen = left.rawLen;
          extraToAppend.info = left.info;
          left = TVar13;
        }
LAB_00186e0c:
        bVar27 = false;
      }
LAB_00186e0e:
      if ((Info *)stack0xfffffffffffffc80 != (Info *)0x0) {
        if (local_388._0_2_ == EmptyMacroArgument) {
          left = (Token)Token::trivia((Token *)local_388);
          sourceManager = (SourceManager *)&left;
          SmallVectorBase<slang::parsing::Trivia>::
          append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                    (&emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>,
                     (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)sourceManager);
        }
        else {
          if (emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>.len != 0) {
            left = (Token)Token::trivia((Token *)local_388);
            SmallVectorBase<slang::parsing::Trivia>::
            append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                      (&emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>,
                       (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)&left);
            pBVar7 = this->alloc;
            iVar17 = SmallVectorBase<slang::parsing::Trivia>::copy
                               (&emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>,
                                (EVP_PKEY_CTX *)pBVar7,src);
            sVar28._M_ptr._4_4_ = extraout_var;
            sVar28._M_ptr._0_4_ = iVar17;
            sVar28._M_extent._M_extent_value = extraout_RDX._M_extent_value;
            _local_388 = (undefined1  [16])Token::withTrivia((Token *)local_388,pBVar7,sVar28);
            emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>.len = 0;
          }
          if (stringify.info == (Info *)0x0) {
            if (syntheticComment.info == (Info *)0x0) {
              sourceManager = (SourceManager *)local_388;
              SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                        ((SmallVectorBase<slang::parsing::Token> *)local_370,(Token *)sourceManager)
              ;
              if (extraToAppend.info != (Info *)0x0) {
                sourceManager = (SourceManager *)&extraToAppend;
                SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                          ((SmallVectorBase<slang::parsing::Token> *)local_370,
                           (Token *)sourceManager);
                Token::Token(&left);
                TVar13 = left;
                extraToAppend.kind = left.kind;
                extraToAppend._2_1_ = left._2_1_;
                extraToAppend.numFlags.raw = left.numFlags.raw;
                extraToAppend.rawLen = left.rawLen;
                extraToAppend.info = left.info;
                left = TVar13;
              }
            }
            else {
              sourceManager = (SourceManager *)local_388;
              SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                        (&commentBuffer.super_SmallVectorBase<slang::parsing::Token>,
                         (Token *)sourceManager);
            }
          }
          else {
            raw = Token::rawText((Token *)local_388);
            if (((raw._M_len != 0 && local_388._0_2_ == Identifier) && (*raw._M_str == '\\')) &&
               (__pos = std::basic_string_view<char,_std::char_traits<char>_>::find(&raw,"`\"",0),
               __pos != 0xffffffffffffffff)) {
              TVar14 = stringify.kind;
              left = (Token)std::basic_string_view<char,_std::char_traits<char>_>::substr
                                      (&raw,__pos,0xffffffffffffffff);
              bVar16 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&left,
                                  "`\"\"\"");
              if (TVar14 != MacroTripleQuote || bVar16) {
                pBVar7 = this->alloc;
                local_238 = (pointer)_Var22._M_extent_value;
                rawText_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                       (&raw,0,__pos);
                left = Token::withRawText((Token *)local_388,pBVar7,rawText_00);
                SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                          (&stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>,&left);
                uVar11 = stringify._0_8_;
                parentLexer.super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl =
                     (this->lexerStack).
                     super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                     .data_[(this->lexerStack).
                            super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                            .len - 1]._M_t.
                     super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                     .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>;
                local_240 = (pointer)stringify.info;
                bodyTokens_01._M_extent._M_extent_value =
                     stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.len;
                bodyTokens_01._M_ptr =
                     stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.data_;
                auStack_250._8_8_ = this;
                Token::Token((Token *)&local_208);
                uVar15 = stringify._0_8_;
                endToken.info = (Info *)p_Stack_200;
                endToken._0_8_ = local_208;
                startToken_01.info = (Info *)local_240;
                stringify.kind = (TokenKind)uVar11;
                stringify._2_1_ = SUB81(uVar11,2);
                stringify.numFlags.raw = SUB81(uVar11,3);
                stringify.rawLen = SUB84(uVar11,4);
                startToken_01.kind = stringify.kind;
                startToken_01._2_1_ = stringify._2_1_;
                startToken_01.numFlags.raw = stringify.numFlags.raw;
                startToken_01.rawLen = stringify.rawLen;
                stringify._0_8_ = uVar15;
                left = Lexer::stringify((Lexer *)parentLexer.
                                                 super__Head_base<0UL,_slang::parsing::Lexer_*,_false>
                                                 ._M_head_impl,startToken_01,bodyTokens_01,endToken)
                ;
                SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                          ((SmallVectorBase<slang::parsing::Token> *)local_370,&left);
                in_R8._M_extent_value = (size_t)&left;
                Token::Token((Token *)in_R8._M_extent_value);
                _Var22._M_extent_value = (size_t)local_238;
                this = (Preprocessor *)auStack_250._8_8_;
                stringify.kind = left.kind;
                stringify._2_1_ = left._2_1_;
                stringify.numFlags.raw = left.numFlags.raw;
                stringify.rawLen = left.rawLen;
                stringify.info = left.info;
                left.info = (Info *)0x0;
                left._0_8_ = local_2e0;
                splitTokens((Preprocessor *)auStack_250._8_8_,(Token)_local_388,
                            __pos + 2 + (ulong)bVar16 * 2,
                            (SmallVectorBase<slang::parsing::Token> *)in_R8._M_extent_value);
                sourceManager = (SourceManager *)left._0_8_;
                bVar16 = applyMacroOps(this,(span<const_slang::parsing::Token,_18446744073709551615UL>
                                             )left,
                                       (SmallVectorBase<slang::parsing::Token> *)local_370);
                bVar21 = (bool)(bVar21 | bVar16);
                SmallVectorBase<slang::parsing::Token>::cleanup
                          ((SmallVectorBase<slang::parsing::Token> *)&left,
                           (EVP_PKEY_CTX *)sourceManager);
                goto LAB_001871a5;
              }
            }
            sourceManager = (SourceManager *)local_388;
            SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                      (&stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>,
                       (Token *)sourceManager);
          }
        }
      }
    }
    else {
      if (token.kind != MacroPaste) {
        if ((bVar27) &&
           (sVar28 = Token::trivia(&token),
           sVar28._M_extent._M_extent_value._M_extent_value == 0 &&
           emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>.len == 0)) {
          sourceManager = this->sourceManager;
          lVar24 = *(size_type *)(local_370 + 8) * 0x10;
          in_R8._M_extent_value = CONCAT44(token.rawLen,CONCAT22(token._2_2_,token.kind));
          TVar13._2_1_ = token._2_1_;
          TVar13.numFlags.raw = token.numFlags.raw;
          TVar13.kind = token.kind;
          TVar13.rawLen = token.rawLen;
          TVar13.info._0_4_ = token.info._0_4_;
          TVar13.info._4_4_ = token.info._4_4_;
          left_00.info = *(Info **)(*(long *)local_370 + -8 + lVar24);
          left_00._0_8_ = *(undefined8 *)(*(long *)local_370 + -0x10 + lVar24);
          _local_388 = (undefined1  [16])
                       Lexer::concatenateTokens(this->alloc,sourceManager,left_00,TVar13);
          if (local_388._8_8_ != (Info *)0x0) {
            *(size_type *)(local_370 + 8) = *(size_type *)(local_370 + 8) - 1;
            bVar27 = true;
            goto LAB_00186e0e;
          }
        }
        local_388._0_4_ = CONCAT22(token._2_2_,token.kind);
        local_388._4_4_ = token.rawLen;
        local_388._8_4_ = token.info._0_4_;
        uStack_37c = token.info._4_4_;
LAB_00186cec:
        goto LAB_00186e0c;
      }
      if ((ppVar26 == local_230 || ppVar26 == (pointer)0x0) ||
         (sVar28 = Token::trivia(&token), sVar28._M_extent._M_extent_value._M_extent_value != 0)) {
LAB_00186c1f:
        SVar20 = Token::location(&token);
        addDiag(this,(DiagCode)0x230004,SVar20);
        left = (Token)Token::trivia(&token);
        sourceManager = (SourceManager *)&left;
        SmallVectorBase<slang::parsing::Trivia>::
        append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                  (&emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>,
                   (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)sourceManager);
        goto LAB_00186e0c;
      }
      ppVar2 = (pointer)((long)&(ppVar26->_M_pathname)._M_dataplus._M_p + 1);
      pTVar19 = (Token *)((pSVar25->mutex)._M_impl._M_rwlock.__size +
                         (long)&ppVar26->_M_pathname * 0x10 + 0x10);
      sVar28 = Token::trivia(pTVar19);
      if (sVar28._M_extent._M_extent_value._M_extent_value != 0 ||
          emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>.len != 0) goto LAB_00186c1f;
      if (stringify.info == (Info *)0x0) {
        if (syntheticComment.info == (Info *)0x0) {
          lVar24 = *(size_type *)(local_370 + 8) * 0x10;
          pTVar4 = (Token *)(*(long *)local_370 + -0x10 + lVar24);
          uVar11._0_2_ = pTVar4->kind;
          uVar11._2_1_ = pTVar4->field_0x2;
          uVar11._3_1_ = (pTVar4->numFlags).raw;
          uVar11._4_4_ = pTVar4->rawLen;
          pIVar12 = pTVar4->info;
          left = *pTVar4;
          auStack_250._0_6_ = (undefined6)((ulong)pTVar19->info >> 0x10);
          uStack_258 = (undefined6)*(undefined8 *)&pTVar19->field_0x2;
          local_252 = (undefined2)((ulong)*(undefined8 *)&pTVar19->field_0x2 >> 0x30);
          if (((TokenKind)uVar11 != Slash) || (pTVar19->kind != Star)) {
            sourceManager = this->sourceManager;
            in_R8._M_extent_value = *(size_t *)pTVar19;
            _local_388 = (undefined1  [16])
                         Lexer::concatenateTokens
                                   (this->alloc,sourceManager,
                                    *(Token *)(*(long *)local_370 + lVar24 + -0x10),*pTVar19);
            if (local_388._8_8_ == (Info *)0x0) {
              bVar27 = false;
            }
            else {
              *(size_type *)(local_370 + 8) = *(size_type *)(local_370 + 8) - 1;
              if (local_388._0_2_ == Directive) {
                SVar18 = Token::directiveKind((Token *)local_388);
                bVar27 = SVar18 == MacroUsage;
              }
              else {
                bVar27 = false;
              }
              bVar21 = (bool)(bVar21 | bVar27);
              bVar27 = true;
              ppVar26 = ppVar2;
            }
            goto LAB_00186e0e;
          }
          commentBuffer.super_SmallVectorBase<slang::parsing::Token>.len = 0;
          *(size_type *)(local_370 + 8) = *(size_type *)(local_370 + 8) - 1;
          syntheticComment._0_8_ = uVar11;
          syntheticComment.info = pIVar12;
          raw = (string_view)
                Token::withTrivia(&left,this->alloc,
                                  (span<const_slang::parsing::Trivia,_18446744073709551615UL>)
                                  ZEXT816(0));
          sourceManager = (SourceManager *)&raw;
          SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                    (&commentBuffer.super_SmallVectorBase<slang::parsing::Token>,
                     (Token *)sourceManager);
          local_388._8_2_ = local_252;
          local_388._2_6_ = uStack_258;
          local_388._0_2_ = Star;
          stack0xfffffffffffffc82 = auStack_250._0_6_;
        }
        else {
          if ((commentBuffer.super_SmallVectorBase<slang::parsing::Token>.data_
               [commentBuffer.super_SmallVectorBase<slang::parsing::Token>.len - 1].kind != Star) ||
             (pTVar19->kind != Slash)) goto LAB_00186e0c;
          SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                    (&commentBuffer.super_SmallVectorBase<slang::parsing::Token>,pTVar19);
          left = (Token)Token::trivia(&syntheticComment);
          SmallVectorBase<slang::parsing::Trivia>::
          append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                    (&emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>,
                     (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)&left);
          tokens_00._M_extent._M_extent_value = in_R8._M_extent_value;
          tokens_00._M_ptr = (pointer)commentBuffer.super_SmallVectorBase<slang::parsing::Token>.len
          ;
          TVar29 = Lexer::commentify((Lexer *)this->alloc,(BumpAllocator *)this->sourceManager,
                                     (SourceManager *)
                                     commentBuffer.super_SmallVectorBase<slang::parsing::Token>.
                                     data_,tokens_00);
          left._0_14_ = TVar29._0_14_;
          sourceManager = (SourceManager *)&left;
          SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                    (&emptyArgTrivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&left);
          Token::Token(&left);
          TVar13 = left;
          syntheticComment.kind = left.kind;
          syntheticComment._2_1_ = left._2_1_;
          syntheticComment.numFlags.raw = left.numFlags.raw;
          syntheticComment.rawLen = left.rawLen;
          syntheticComment.info = left.info;
          left = TVar13;
        }
LAB_001873b0:
        bVar27 = false;
        ppVar26 = ppVar2;
        goto LAB_00186e0e;
      }
      if ((stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.len == 0) ||
         ((pTVar19->kind & ~EndOfFile) == MacroQuote)) {
        SVar20 = Token::location(&token);
        sourceManager = (SourceManager *)0x230004;
        addDiag(this,(DiagCode)0x230004,SVar20);
        goto LAB_00186e0c;
      }
      sourceManager = this->sourceManager;
      pTVar3 = stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.data_ +
               (stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.len - 1);
      uVar6 = pTVar3->kind;
      uVar8 = pTVar3->field_0x2;
      uVar9 = pTVar3->numFlags;
      uVar10 = pTVar3->rawLen;
      left_01.rawLen = uVar10;
      left_01.numFlags.raw = uVar9;
      left_01._2_1_ = uVar8;
      left_01.kind = uVar6;
      in_R8._M_extent_value = *(size_t *)pTVar19;
      left_01.info = stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.data_
                     [stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.len - 1].info;
      _local_388 = (undefined1  [16])
                   Lexer::concatenateTokens(this->alloc,sourceManager,left_01,*pTVar19);
      if (local_388._8_8_ != (Info *)0x0) {
        stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.len =
             stringifyBuffer.super_SmallVectorBase<slang::parsing::Token>.len - 1;
        goto LAB_001873b0;
      }
      bVar27 = false;
    }
LAB_001871a5:
    ppVar26 = (pointer)((long)&(ppVar26->_M_pathname)._M_dataplus._M_p + 1);
  } while( true );
}

Assistant:

bool Preprocessor::applyMacroOps(std::span<Token const> tokens, SmallVectorBase<Token>& dest) {
    SmallVector<Trivia, 8> emptyArgTrivia;
    SmallVector<Token, 8> stringifyBuffer;
    SmallVector<Token, 8> commentBuffer;
    Token stringify;
    Token syntheticComment;
    Token extraToAppend;
    bool anyNewMacros = false;
    bool didConcat = false;

    for (size_t i = 0; i < tokens.size(); i++) {
        Token newToken;
        bool nextDidConcat = false;

        // Once we see a `" token, we start collecting tokens into their own
        // buffer for stringification. Otherwise, just add them to the final
        // expansion buffer.
        Token token = tokens[i];
        switch (token.kind) {
            case TokenKind::MacroQuote:
            case TokenKind::MacroTripleQuote:
                if (!stringify) {
                    stringify = token;
                    stringifyBuffer.clear();

                    if (token.kind == TokenKind::MacroTripleQuote &&
                        options.languageVersion < LanguageVersion::v1800_2023) {
                        addDiag(diag::WrongLanguageVersion, token.location())
                            << toString(options.languageVersion);
                    }
                }
                else if (token.kind == stringify.kind) {
                    // all done stringifying; convert saved tokens to string
                    newToken = Lexer::stringify(*lexerStack.back(), stringify, stringifyBuffer,
                                                token);
                    stringify = Token();
                }
                else if (stringify.kind == TokenKind::MacroTripleQuote) {
                    // We found a `" inside of a triple quoted stringification.
                    // Just keep it, let it become part of the string contents.
                    newToken = token;
                }
                else {
                    // We found a `""" inside of a single quoted stringification.
                    // The LRM doesn't say what to do, but I think it makes sense to
                    // split the token, end the previous stringification, and then
                    // append the essentially empty string literal after it.
                    // This will cause an error down the line since two string literals
                    // next to each other isn't ever valid.
                    newToken = Lexer::stringify(*lexerStack.back(), stringify, stringifyBuffer,
                                                token);
                    stringify = Token();
                    extraToAppend = Token(alloc, TokenKind::StringLiteral, {}, "\"\"",
                                          token.location() + 2, ""sv);
                }
                break;
            case TokenKind::MacroPaste:
                // Paste together previous token and next token; a macro paste on either end
                // of the buffer or one that borders whitespace should be ignored.
                // This isn't specified in the standard so I'm just guessing.
                if (i == 0 || i == tokens.size() - 1 || !token.trivia().empty() ||
                    !tokens[i + 1].trivia().empty() || !emptyArgTrivia.empty()) {

                    addDiag(diag::IgnoredMacroPaste, token.location());

                    // We're ignoring this token, but don't lose its trivia or our
                    // spacing can get messed up.
                    emptyArgTrivia.append_range(token.trivia());
                }
                else if (stringify) {
                    // If this is right after the opening quote or right before the closing quote,
                    // we're trying to concatenate something with nothing.
                    if (stringifyBuffer.empty() || tokens[i + 1].kind == TokenKind::MacroQuote ||
                        tokens[i + 1].kind == TokenKind::MacroTripleQuote) {
                        addDiag(diag::IgnoredMacroPaste, token.location());
                    }
                    else {
                        newToken = Lexer::concatenateTokens(alloc, sourceManager,
                                                            stringifyBuffer.back(), tokens[i + 1]);
                        if (newToken) {
                            stringifyBuffer.pop_back();
                            ++i;
                        }
                    }
                }
                else if (syntheticComment) {
                    // Check for a *``/ to end the synthetic comment. Otherwise ignore the paste,
                    // since this is just going to become a comment anyway.
                    if (commentBuffer.back().kind == TokenKind::Star &&
                        tokens[i + 1].kind == TokenKind::Slash) {
                        commentBuffer.push_back(tokens[i + 1]);
                        i++;

                        emptyArgTrivia.append_range(syntheticComment.trivia());
                        emptyArgTrivia.push_back(
                            Lexer::commentify(alloc, sourceManager, commentBuffer));
                        syntheticComment = Token();
                    }
                }
                else {
                    // Dest cannot be empty here, though it's not easy to see why at first glance.
                    Token left = dest.back();
                    Token right = tokens[i + 1];

                    // Other tools allow concatenating a '/' with a '*' to form a block comment.
                    // This seems like utter nonsense but real world code depends on it so
                    // we have to support it as well.
                    if (left.kind == TokenKind::Slash && right.kind == TokenKind::Star) {
                        commentBuffer.clear();
                        syntheticComment = left;
                        dest.pop_back();
                        ++i;

                        commentBuffer.push_back(left.withTrivia(alloc, {}));
                        newToken = right;
                    }
                    else {
                        newToken = Lexer::concatenateTokens(alloc, sourceManager, dest.back(),
                                                            tokens[i + 1]);
                        if (newToken) {
                            dest.pop_back();
                            ++i;

                            nextDidConcat = true;
                            anyNewMacros |= newToken.kind == TokenKind::Directive &&
                                            newToken.directiveKind() == SyntaxKind::MacroUsage;
                        }
                    }
                }
                break;
            default: {
                // If last iteration we did a token concatenation, check whether this token
                // is right next to it (not leading trivia). If so, we should try to
                // continue the concatenation process.
                if (didConcat && token.trivia().empty() && emptyArgTrivia.empty()) {
                    newToken = Lexer::concatenateTokens(alloc, sourceManager, dest.back(), token);
                    if (newToken) {
                        dest.pop_back();
                        nextDidConcat = true;
                        break;
                    }
                }

                // Otherwise take the token as it is.
                newToken = token;
                break;
            }
        }

        didConcat = nextDidConcat;
        if (!newToken)
            continue;

        // If we have an empty macro argument just collect its trivia and use it on the next token
        // we find. Note that this can be left over at the end of applying ops; that's fine,
        // nothing is relying on observing this after the end of the macro's tokens.
        if (newToken.kind == TokenKind::EmptyMacroArgument) {
            emptyArgTrivia.append_range(newToken.trivia());
            continue;
        }

        if (!emptyArgTrivia.empty()) {
            emptyArgTrivia.append_range(newToken.trivia());
            newToken = newToken.withTrivia(alloc, emptyArgTrivia.copy(alloc));
            emptyArgTrivia.clear();
        }

        if (!stringify) {
            if (syntheticComment) {
                commentBuffer.push_back(newToken);
            }
            else {
                dest.push_back(newToken);
                if (extraToAppend) {
                    dest.push_back(extraToAppend);
                    extraToAppend = Token();
                }
            }
            continue;
        }

        // If this is an escaped identifier that includes a `" within it, we need to split the
        // token up to match the behavior of other simulators.
        auto raw = newToken.rawText();
        if (newToken.kind == TokenKind::Identifier && !raw.empty() && raw[0] == '\\') {
            size_t offset = raw.find("`\"");
            if (offset != std::string_view::npos) {
                // Like above, we need to handle the case of mismatched delimiters.
                // If we match, we complete the stringification. If we found a `"
                // inside a triple quoted string, just keep going. If we found a `"""
                // inside a single quoted string, split and end.
                const bool startIsTriple = stringify.kind == TokenKind::MacroTripleQuote;
                const bool endIsTriple = raw.substr(offset).starts_with(R"(`""")");
                if (startIsTriple == endIsTriple || !startIsTriple) {
                    stringifyBuffer.push_back(newToken.withRawText(alloc, raw.substr(0, offset)));

                    // Note: endToken parameter here doesn't matter,
                    // we know there is no trivia to take.
                    dest.push_back(
                        Lexer::stringify(*lexerStack.back(), stringify, stringifyBuffer, Token()));
                    stringify = Token();

                    // Now we have the unfortunate task of re-lexing the remaining stuff after the
                    // split and then appending those tokens to the destination as well.
                    SmallVector<Token, 8> splits;
                    splitTokens(newToken, offset + (endIsTriple ? 4 : 2), splits);
                    anyNewMacros |= applyMacroOps(splits, dest);
                    continue;
                }
            }
        }

        stringifyBuffer.push_back(newToken);
    }

    if (stringify)
        addDiag(diag::ExpectedMacroStringifyEnd, stringify.location());

    return anyNewMacros;
}